

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

TType * __thiscall
glslang::HlslParseContext::getStructBufferContentType(HlslParseContext *this,TType *type)

{
  TType *pTVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  
  iVar2 = (*type->_vptr_TType[7])(type);
  if ((iVar2 != 0x10) ||
     (iVar2 = (*type->_vptr_TType[0xb])(type),
     (*(uint *)(CONCAT44(extraout_var,iVar2) + 8) & 0x7f) != 6)) {
    return (TType *)0x0;
  }
  iVar2 = (*type->_vptr_TType[0x25])(type);
  if ((char)iVar2 != '\0') {
    iVar2 = (int)((long)(((type->field_13).referentType)->qualifier).semanticName -
                  *(long *)&((type->field_13).referentType)->field_0x8 >> 5);
    if (iVar2 < 1) {
      __assert_fail("memberCount > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0x1b5d,
                    "TType *glslang::HlslParseContext::getStructBufferContentType(const TType &) const"
                   );
    }
    iVar3 = (*type->_vptr_TType[0x25])(type);
    if ((char)iVar3 != '\0') {
      pTVar1 = (((type->field_13).structure)->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start[iVar2 - 1].type;
      iVar2 = (*pTVar1->_vptr_TType[0x1f])(pTVar1);
      if ((char)iVar2 == '\0') {
        return (TType *)0x0;
      }
      return pTVar1;
    }
  }
  __assert_fail("isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
}

Assistant:

TType* HlslParseContext::getStructBufferContentType(const TType& type) const
{
    if (type.getBasicType() != EbtBlock || type.getQualifier().storage != EvqBuffer)
        return nullptr;

    const int memberCount = (int)type.getStruct()->size();
    assert(memberCount > 0);

    TType* contentType = (*type.getStruct())[memberCount-1].type;

    return contentType->isUnsizedArray() ? contentType : nullptr;
}